

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spl_sqrt_floor.c
# Opt level: O2

int32_t WebRtcSpl_SqrtFloor(int32_t value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  iVar2 = value + -0x40000000;
  if (value < 0x40000000) {
    iVar2 = value;
  }
  uVar4 = (uint)(0x3fffffff < value) * 0x10000;
  uVar3 = (uint)(0x3fffffff < value) << 0x1e | 0x10000000;
  uVar1 = 0;
  uVar6 = uVar4 + 0x8000;
  if (iVar2 < (int)uVar3) {
    uVar3 = 0;
    uVar6 = uVar4;
  }
  uVar5 = uVar6 << 0xd | 0x4000000;
  uVar4 = uVar6 | 0x4000;
  if ((int)(iVar2 - uVar3) < (int)uVar5) {
    uVar5 = 0;
    uVar4 = uVar6;
  }
  iVar2 = (iVar2 - uVar3) - uVar5;
  uVar6 = uVar4 << 0xc | 0x1000000;
  uVar3 = uVar4 + 0x2000;
  if (iVar2 < (int)uVar6) {
    uVar3 = uVar4;
    uVar6 = uVar1;
  }
  iVar2 = iVar2 - uVar6;
  iVar7 = uVar3 * 0x800 + 0x400000;
  uVar6 = uVar3 | 0x1000;
  if (iVar2 < iVar7) {
    iVar7 = 0;
    uVar6 = uVar3;
  }
  iVar2 = iVar2 - iVar7;
  uVar3 = uVar6 * 0x400 + 0x100000;
  uVar4 = uVar6 | 0x800;
  if (iVar2 < (int)uVar3) {
    uVar4 = uVar6;
    uVar3 = uVar1;
  }
  iVar2 = iVar2 - uVar3;
  iVar7 = uVar4 * 0x200 + 0x40000;
  uVar6 = uVar4 | 0x400;
  if (iVar2 < iVar7) {
    iVar7 = 0;
    uVar6 = uVar4;
  }
  iVar2 = iVar2 - iVar7;
  uVar4 = uVar6 * 0x100 + 0x10000;
  uVar3 = uVar6 | 0x200;
  if (iVar2 < (int)uVar4) {
    uVar3 = uVar6;
    uVar4 = uVar1;
  }
  iVar2 = iVar2 - uVar4;
  iVar7 = uVar3 * 0x80 + 0x4000;
  uVar6 = uVar3 | 0x100;
  if (iVar2 < iVar7) {
    iVar7 = 0;
    uVar6 = uVar3;
  }
  iVar2 = iVar2 - iVar7;
  uVar3 = uVar6 * 0x40 + 0x1000;
  uVar4 = uVar6 | 0x80;
  if (iVar2 < (int)uVar3) {
    uVar4 = uVar6;
    uVar3 = uVar1;
  }
  iVar2 = iVar2 - uVar3;
  iVar7 = uVar4 * 0x20 + 0x400;
  uVar6 = uVar4 | 0x40;
  if (iVar2 < iVar7) {
    iVar7 = 0;
    uVar6 = uVar4;
  }
  iVar2 = iVar2 - iVar7;
  uVar3 = uVar6 * 0x10 + 0x100;
  uVar4 = uVar6 | 0x20;
  if (iVar2 < (int)uVar3) {
    uVar4 = uVar6;
    uVar3 = uVar1;
  }
  iVar2 = iVar2 - uVar3;
  iVar7 = uVar4 * 8 + 0x40;
  uVar6 = uVar4 | 0x10;
  if (iVar2 < iVar7) {
    iVar7 = 0;
    uVar6 = uVar4;
  }
  iVar2 = iVar2 - iVar7;
  uVar4 = uVar6 * 4 + 0x10;
  uVar3 = uVar6 | 8;
  if (iVar2 < (int)uVar4) {
    uVar3 = uVar6;
    uVar4 = uVar1;
  }
  iVar2 = iVar2 - uVar4;
  iVar7 = uVar3 * 2 + 4;
  uVar6 = uVar3 | 4;
  if (iVar2 < iVar7) {
    iVar7 = 0;
    uVar6 = uVar3;
  }
  return (uint)((int)uVar6 < iVar2 - iVar7) | uVar6 >> 1;
}

Assistant:

int32_t WebRtcSpl_SqrtFloor(int32_t value)
{
  int32_t root = 0, try1;

  WEBRTC_SPL_SQRT_ITER (15);
  WEBRTC_SPL_SQRT_ITER (14);
  WEBRTC_SPL_SQRT_ITER (13);
  WEBRTC_SPL_SQRT_ITER (12);
  WEBRTC_SPL_SQRT_ITER (11);
  WEBRTC_SPL_SQRT_ITER (10);
  WEBRTC_SPL_SQRT_ITER ( 9);
  WEBRTC_SPL_SQRT_ITER ( 8);
  WEBRTC_SPL_SQRT_ITER ( 7);
  WEBRTC_SPL_SQRT_ITER ( 6);
  WEBRTC_SPL_SQRT_ITER ( 5);
  WEBRTC_SPL_SQRT_ITER ( 4);
  WEBRTC_SPL_SQRT_ITER ( 3);
  WEBRTC_SPL_SQRT_ITER ( 2);
  WEBRTC_SPL_SQRT_ITER ( 1);
  WEBRTC_SPL_SQRT_ITER ( 0);

  return root >> 1;
}